

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

void __thiscall
bgui::ImageAdapter<float>::getPixel
          (ImageAdapter<float> *this,double *r,double *g,double *b,float x,float y,int ir,int ig,
          int ib)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  work_t wVar5;
  store_t_conflict1 sVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float in_XMM1_Da;
  int in_stack_00000008;
  double f;
  int ds;
  int j;
  undefined8 in_stack_ffffffffffffff90;
  int j_00;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  float local_28;
  float local_24;
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::
          vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
          ::size((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                  *)(in_RDI + 0x90));
  if (sVar3 == 0) {
    sVar6 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                      (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70),(long)local_24
                       ,(long)local_28,local_2c);
    *local_10 = (double)sVar6;
    sVar6 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                      (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70),(long)local_24
                       ,(long)local_28,local_30);
    *local_18 = (double)sVar6;
    sVar6 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                      (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70),(long)local_24
                       ,(long)local_28,in_stack_00000008);
    *local_20 = (double)sVar6;
  }
  else {
    dVar7 = log(1.0 / *(double *)(in_RDI + 0x48));
    dVar8 = log(2.0);
    local_34 = (int)(dVar7 / dVar8) + -1;
    sVar3 = std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::size((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90));
    local_38 = (int)sVar3 + -1;
    piVar4 = std::min<int>(&local_38,&local_34);
    local_34 = *piVar4;
    iVar1 = 1 << ((char)local_34 + 1U & 0x1f);
    j_00 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    if (local_34 < 0) {
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (float)in_stack_ffffffffffffff98,j_00);
      *local_10 = (double)wVar5;
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (float)in_stack_ffffffffffffff98,j_00);
      *local_18 = (double)wVar5;
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (float)in_stack_ffffffffffffff98,j_00);
      *local_20 = (double)wVar5;
    }
    else {
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90),(long)local_34);
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (float)in_stack_ffffffffffffff98,j_00);
      *local_10 = (double)wVar5;
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90),(long)local_34);
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (float)in_stack_ffffffffffffff98,j_00);
      *local_18 = (double)wVar5;
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90),(long)local_34);
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (float)in_stack_ffffffffffffff98,j_00);
      *local_20 = (double)wVar5;
    }
    if (-1 < local_34 + 1) {
      iVar2 = local_34 + 1;
      sVar3 = std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::size((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                      *)(in_RDI + 0x90));
      if ((iVar2 < (int)sVar3) &&
         (dVar7 = (1.0 / *(double *)(in_RDI + 0x48) - (double)iVar1) / (double)iVar1, 1e-06 < dVar7)
         ) {
        dVar8 = *local_10;
        std::
        vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
        ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                      *)(in_RDI + 0x90),(long)(local_34 + 1));
        wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                          ((Image<float,_gimage::PixelTraits<float>_> *)
                           CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                           (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (float)in_stack_ffffffffffffff98,j_00);
        *local_10 = (1.0 - dVar7) * dVar8 + dVar7 * (double)wVar5;
        dVar8 = *local_18;
        std::
        vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
        ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                      *)(in_RDI + 0x90),(long)(local_34 + 1));
        wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                          ((Image<float,_gimage::PixelTraits<float>_> *)
                           CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                           (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (float)in_stack_ffffffffffffff98,j_00);
        *local_18 = (1.0 - dVar7) * dVar8 + dVar7 * (double)wVar5;
        dVar9 = 1.0 - dVar7;
        dVar8 = *local_20;
        std::
        vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
        ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                      *)(in_RDI + 0x90),(long)(local_34 + 1));
        wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                          ((Image<float,_gimage::PixelTraits<float>_> *)
                           CONCAT44(iVar2,in_stack_ffffffffffffffa0),(float)((ulong)dVar9 >> 0x20),
                           SUB84(dVar9,0),(int)((ulong)dVar8 >> 0x20));
        *local_20 = dVar9 * dVar8 + dVar7 * (double)wVar5;
      }
    }
  }
  return;
}

Assistant:

void getPixel(double &r, double &g, double &b, float x, float y,
                  int ir, int ig, int ib) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);

        if (j < 0)
        {
          r=image->getBilinear(x, y, ir);
          g=image->getBilinear(x, y, ig);
          b=image->getBilinear(x, y, ib);
        }
        else
        {
          r=mipmap[j].getBilinear(x/ds, y/ds, ir);
          g=mipmap[j].getBilinear(x/ds, y/ds, ig);
          b=mipmap[j].getBilinear(x/ds, y/ds, ib);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            r=(1-f)*r+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ir);
            g=(1-f)*g+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ig);
            b=(1-f)*b+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ib);
          }
        }

        return;
      }

      r=image->get(static_cast<long>(x), static_cast<long>(y), ir);
      g=image->get(static_cast<long>(x), static_cast<long>(y), ig);
      b=image->get(static_cast<long>(x), static_cast<long>(y), ib);
    }